

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

void __thiscall
duckdb::WindowQuantileState<long>::SkipListUpdater::Right
          (SkipListUpdater *this,idx_t begin,idx_t end)

{
  bool bVar1;
  long *__y;
  ulong in_RDX;
  ulong in_RSI;
  pair<unsigned_long,_long> *in_stack_00000048;
  HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
  *in_stack_00000050;
  idx_t *in_stack_ffffffffffffffd8;
  QuantileCursor<long> *in_stack_ffffffffffffffe0;
  ulong local_10 [2];
  
  for (local_10[0] = in_RSI; local_10[0] < in_RDX; local_10[0] = local_10[0] + 1) {
    bVar1 = QuantileIncluded<long>::operator()
                      ((QuantileIncluded<long> *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8
                      );
    if (bVar1) {
      __y = QuantileCursor<long>::operator[]
                      (in_stack_ffffffffffffffe0,(idx_t)in_stack_ffffffffffffffd8);
      std::pair<unsigned_long,_long>::pair<unsigned_long_&,_true>
                ((pair<unsigned_long,_long> *)&stack0xffffffffffffffd8,local_10,__y);
      duckdb_skiplistlib::skip_list::
      HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>::
      insert(in_stack_00000050,in_stack_00000048);
    }
  }
  return;
}

Assistant:

inline void Right(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					skip.insert(SkipType(begin, data[begin]));
				}
			}
		}